

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int create_labelmap(string *file_name)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 uVar5;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string outfile_name;
  ofstream outfile;
  ifstream myReadFile;
  
  std::__cxx11::string::string
            ((string *)&outfile_name,"/newdataset/obj.names",(allocator *)&myReadFile);
  std::ofstream::ofstream(&outfile,(string *)&outfile_name,_S_out);
  std::ifstream::ifstream(&myReadFile);
  std::ifstream::open((string *)&myReadFile,(_Ios_Openmode)file_name);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&myReadFile,(string *)&line),
        ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::string::substr((ulong)&local_478,(ulong)&line);
    bVar1 = std::operator==(&local_478,"item {");
    std::__cxx11::string::~string((string *)&local_478);
    if (bVar1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&myReadFile,(string *)&line);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&myReadFile,(string *)&line);
      std::__cxx11::string::substr((ulong)&local_478,(ulong)&line);
      bVar1 = std::operator==(&local_478,"name: ");
      std::__cxx11::string::~string((string *)&local_478);
      if (bVar1) {
        do {
          lVar3 = std::__cxx11::string::find((char *)&line,0x1050d4);
        } while (lVar3 != -1);
        std::__cxx11::string::substr((ulong)&local_478,(ulong)&line);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_478);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::substr((ulong)&local_478,(ulong)&line);
        std::operator<<((ostream *)&outfile,(string *)&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&outfile_name);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::endl<char,std::char_traits<char>>((ostream *)&outfile);
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  uVar5 = std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  std::__cxx11::string::~string((string *)&outfile_name);
  _Unwind_Resume(uVar5);
}

Assistant:

int create_labelmap(string file_name)
{

    string outfile_name = objnames;
    //string outfile_name = labels_voc.substr(0, labels_voc.size()-9) + "obj.names";
    //cout << outfile_name << endl;

    std::ofstream outfile (outfile_name, std::ofstream::out);

    ifstream myReadFile;
    myReadFile.open(file_name);

    for( std::string line; getline( myReadFile, line ); )
    {
        if (line.substr(0,6) == "item {")
        {
            getline( myReadFile, line );
            getline( myReadFile, line );

            int pos_f, pos_i =8;
            if (line.substr(1,6) == "name: ")
            {
                // Find delimiter '
                for(size_t pos=line.find("'",0); pos!=std::string::npos; pos=line.find("'",pos+1))
                    pos_f = pos-pos_i;

                cout << line.substr(pos_i,pos_f) << endl;
                outfile << line.substr(pos_i,pos_f);
                cout << outfile_name << endl;
                outfile << endl;
            }
        }
    }
    outfile.close();
}